

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

bool __thiscall libmatroska::KaxBlockBlob::ReplaceSimpleByGroup(KaxBlockBlob *this)

{
  BlockBlobType BVar1;
  KaxBlockGroup *this_00;
  KaxBlockGroup *this_01;
  
  BVar1 = this->SimpleBlockMode;
  if (BVar1 == BLOCK_BLOB_ALWAYS_SIMPLE) goto LAB_0018c2f5;
  this_01 = (this->Block).group;
  if (this->bUseSimpleBlock == false) {
    if (this_01 == (KaxBlockGroup *)0x0) {
      this_00 = (KaxBlockGroup *)operator_new(0xb8);
      KaxBlockGroup::KaxBlockGroup(this_00);
      goto LAB_0018c2da;
    }
  }
  else {
    this_00 = (KaxBlockGroup *)operator_new(0xb8);
    if (this_01 != (KaxBlockGroup *)0x0) {
      KaxBlockGroup::KaxBlockGroup(this_00);
      (this->Block).group = this_00;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x413,"bool libmatroska::KaxBlockBlob::ReplaceSimpleByGroup()");
    }
    KaxBlockGroup::KaxBlockGroup(this_00);
LAB_0018c2da:
    (this->Block).group = this_00;
    this_01 = this_00;
  }
  if (this->ParentCluster != (KaxCluster *)0x0) {
    KaxBlockGroup::SetParent(this_01,this->ParentCluster);
  }
  this->bUseSimpleBlock = false;
LAB_0018c2f5:
  return BVar1 != BLOCK_BLOB_ALWAYS_SIMPLE;
}

Assistant:

bool KaxBlockBlob::ReplaceSimpleByGroup()
{
  if (SimpleBlockMode== BLOCK_BLOB_ALWAYS_SIMPLE)
    return false;

  if (!bUseSimpleBlock) {
    if (Block.group == NULL) {
      Block.group = new KaxBlockGroup();
    }
  }
#if MATROSKA_VERSION >= 2
  else {

    if (Block.simpleblock != NULL) {
      KaxSimpleBlock *old_simpleblock = Block.simpleblock;
      Block.group = new KaxBlockGroup();
      // _TODO_ : move all the data to the blockgroup
      assert(false);
      // -> while(frame) AddFrame(myBuffer)
      delete old_simpleblock;
    } else {
      Block.group = new KaxBlockGroup();
    }
  }
#endif
  if (ParentCluster != NULL)
    Block.group->SetParent(*ParentCluster);

  bUseSimpleBlock = false;
  return true;
}